

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

string __thiscall mjs::to_string(mjs *this,gc_heap *h,value *v)

{
  bool bVar1;
  gc_heap_ptr_untyped *p;
  wostream *os;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  double m;
  string sVar3;
  wstring_view local_1a8;
  wostringstream _woss;
  undefined8 uVar2;
  
  switch(v->type_) {
  case undefined:
    __woss = 9;
    break;
  case null:
    __woss = 4;
    break;
  case boolean:
    bVar1 = value::boolean_value(v);
    __woss = (ulong)bVar1 ^ 5;
    break;
  case number:
    m = value::number_value(v);
    sVar3 = to_string(this,h,m);
    uVar2 = sVar3.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_;
    goto LAB_00154593;
  case string:
    p = (gc_heap_ptr_untyped *)value::string_value(v);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped((gc_heap_ptr_untyped *)this,p);
    uVar2 = extraout_RDX;
    goto LAB_00154593;
  case object:
    to_primitive((value *)&_woss,v,string);
    to_string(this,h,(value *)&_woss);
    value::~value((value *)&_woss);
    uVar2 = extraout_RDX_01;
    goto LAB_00154593;
  default:
    std::__cxx11::wostringstream::wostringstream((wostringstream *)&_woss);
    os = std::operator<<((wostream *)&_woss,"Not implemented: ");
    operator<<(os,v->type_);
    std::__cxx11::wstringbuf::str();
    throw_runtime_error(&local_1a8,
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.cpp"
                        ,0xe6);
  }
  string::string((string *)this,h,(string_view *)&_woss);
  uVar2 = extraout_RDX_00;
LAB_00154593:
  sVar3.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ = uVar2;
  sVar3.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (string)sVar3.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped;
}

Assistant:

string to_string(gc_heap& h, const value& v) {
    switch (v.type()) {
    case value_type::undefined: return string{h, "undefined"};
    case value_type::null:      return string{h, "null"};
    case value_type::boolean:   return string{h, v.boolean_value() ? "true" : "false"};
    case value_type::number:    return to_string(h, v.number_value());
    case value_type::string:    return v.string_value();
    case value_type::object:    return to_string(h, to_primitive(v, value_type::string));
    case value_type::reference: break;
    }
    NOT_IMPLEMENTED(v.type());
}